

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O2

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeLinear>::TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *this,TPZCompMesh *mesh,TPZGeoEl *gel)

{
  TPZGeoEl *pTVar1;
  
  *(undefined ***)
   &(this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>).super_TPZIntelGen<pzshape::TPZShapeLinear>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZSavable_0174aa68;
  TPZCompElHDiv<pzshape::TPZShapeLinear>::TPZCompElHDiv
            (&this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>,&PTR_PTR_01747f18,mesh,gel,
             EHDivStandard);
  *(undefined ***)
   &(this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>).super_TPZIntelGen<pzshape::TPZShapeLinear>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElHDivCollapsed_01747b40;
  *(undefined4 *)&this->fbottom_c_index = 0xffffffff;
  *(undefined4 *)((long)&this->fbottom_c_index + 4) = 0xffffffff;
  *(undefined4 *)&this->ftop_c_index = 0xffffffff;
  *(undefined4 *)((long)&this->ftop_c_index + 4) = 0xffffffff;
  this->fbottom_side_orient = -1;
  this->ftop_side_orient = 1;
  pTVar1 = TPZCompEl::Reference((TPZCompEl *)this);
  pTVar1->fReference = (TPZCompEl *)this;
  return;
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::TPZCompElHDivCollapsed(TPZCompMesh &mesh, TPZGeoEl *gel) :
TPZRegisterClassId(&TPZCompElHDivCollapsed::ClassId),
TPZCompElHDiv<TSHAPE>(mesh,gel)
{
//    fbottom_c_index = -1; set at constructor in .h
//    ftop_c_index = -1; set at constructor in .h
//    fbottom_side_orient = -1; in .h
//    ftop_side_orient = 1; in .h
    this->Reference()->SetReference(this);
    

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	 {
         std::stringstream sout;
         sout << "Finalizando criacao do elemento ";
         this->Print(sout);
         LOGPZ_DEBUG(logger,sout.str())
	 }
#endif
	 
}